

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ast_printer.c
# Opt level: O0

void print_symbol_list(TextBuffer *buf,LuaSymbolList *list,int level,char *delimiter)

{
  undefined1 local_50 [8];
  PtrListIterator nodeiter__;
  LuaSymbol *pLStack_30;
  _Bool is_first;
  LuaSymbol *node;
  char *delimiter_local;
  int level_local;
  LuaSymbolList *list_local;
  TextBuffer *buf_local;
  
  nodeiter__._23_1_ = 1;
  raviX_ptrlist_forward_iterator((PtrListIterator *)local_50,(PtrList *)list);
  pLStack_30 = (LuaSymbol *)raviX_ptrlist_iter_next((PtrListIterator *)local_50);
  while (pLStack_30 != (LuaSymbol *)0x0) {
    if ((nodeiter__._23_1_ & 1) == 0) {
      if (delimiter != (char *)0x0) {
        printf_buf(buf,"%p%s\n",(ulong)(uint)level,delimiter);
      }
    }
    else {
      nodeiter__._23_1_ = 0;
    }
    print_symbol(buf,pLStack_30,level + 1);
    pLStack_30 = (LuaSymbol *)raviX_ptrlist_iter_next((PtrListIterator *)local_50);
  }
  return;
}

Assistant:

static void print_symbol_list(TextBuffer *buf, LuaSymbolList *list, int level, const char *delimiter)
{
	LuaSymbol *node;
	bool is_first = true;
	FOR_EACH_PTR(list, LuaSymbol, node)
	{
		if (is_first)
			is_first = false;
		else if (delimiter)
			printf_buf(buf, "%p%s\n", level, delimiter);
		print_symbol(buf, node, level + 1);
	}
	END_FOR_EACH_PTR(node);
}